

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O2

void __thiscall chrono::ChTimestepperLeapfrog::~ChTimestepperLeapfrog(ChTimestepperLeapfrog *this)

{
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperLeapfrog_0118f388;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->Aold);
  ChTimestepperIIorder::~ChTimestepperIIorder(&this->super_ChTimestepperIIorder);
  return;
}

Assistant:

class ChApi ChTimestepperLeapfrog : public ChTimestepperIIorder {
  protected:
    ChStateDelta Aold;

  public:
    /// Constructors (default empty)
    ChTimestepperLeapfrog(ChIntegrableIIorder* intgr = nullptr) : ChTimestepperIIorder(intgr) {}

    virtual Type GetType() const override { return Type::LEAPFROG; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}